

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTrFunc.cpp
# Opt level: O0

bool __thiscall NaTransFunc::Empty(NaTransFunc *this)

{
  int iVar1;
  uint uVar2;
  long in_RDI;
  bool bFlag;
  undefined1 local_19;
  undefined1 local_9;
  
  if (*(uint *)(in_RDI + 0x40) < 2) {
    iVar1 = NaDynAr<NaTransFunc_*>::count((NaDynAr<NaTransFunc_*> *)(in_RDI + 0x48));
    local_9 = iVar1 == 0;
  }
  else if (*(uint *)(in_RDI + 0x40) == 2) {
    uVar2 = NaVector::dim((NaVector *)(in_RDI + 0xa8));
    local_19 = false;
    if (uVar2 == 0) {
      uVar2 = NaVector::dim((NaVector *)(in_RDI + 0xc0));
      local_19 = uVar2 == 0;
    }
    local_9 = local_19;
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool
NaTransFunc::Empty () const
{
    bool    bFlag;
    switch(ut){
    case utSum:
    case utProduct:
        bFlag = (0 == items.count());
        break;
    case utPolyFrac:
        bFlag = (0 == pf.num.dim() && 0 == pf.den.dim());
        break;
    }
    return bFlag;
}